

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_send_message(connectdata *conn,uchar cmd,void *msg,size_t msg_len)

{
  Curl_easy *pCVar1;
  void *pvVar2;
  __pid_t _Var3;
  CURLcode CVar4;
  ushort uVar5;
  
  pCVar1 = conn->data;
  pvVar2 = (pCVar1->req).protop;
  (pCVar1->state).uploadbuffer[0] = '\0';
  (pCVar1->state).uploadbuffer[1] = '\0';
  (pCVar1->state).uploadbuffer[2] = '\0';
  (pCVar1->state).uploadbuffer[3] = '\0';
  (pCVar1->state).uploadbuffer[4] = '\0';
  (pCVar1->state).uploadbuffer[5] = '\0';
  (pCVar1->state).uploadbuffer[6] = '\0';
  (pCVar1->state).uploadbuffer[7] = '\0';
  (pCVar1->state).uploadbuffer[8] = '\0';
  (pCVar1->state).uploadbuffer[9] = '\0';
  (pCVar1->state).uploadbuffer[10] = '\0';
  (pCVar1->state).uploadbuffer[0xb] = '\0';
  (pCVar1->state).uploadbuffer[0xc] = '\0';
  (pCVar1->state).uploadbuffer[0xd] = '\0';
  (pCVar1->state).uploadbuffer[0xe] = '\0';
  (pCVar1->state).uploadbuffer[0xf] = '\0';
  (pCVar1->state).uploadbuffer[0x10] = '\0';
  (pCVar1->state).uploadbuffer[0x11] = '\0';
  (pCVar1->state).uploadbuffer[0x12] = '\0';
  (pCVar1->state).uploadbuffer[0x13] = '\0';
  (pCVar1->state).uploadbuffer[0x14] = '\0';
  (pCVar1->state).uploadbuffer[0x15] = '\0';
  (pCVar1->state).uploadbuffer[0x16] = '\0';
  (pCVar1->state).uploadbuffer[0x17] = '\0';
  (pCVar1->state).uploadbuffer[0x18] = '\0';
  (pCVar1->state).uploadbuffer[0x19] = '\0';
  (pCVar1->state).uploadbuffer[0x1a] = '\0';
  (pCVar1->state).uploadbuffer[0x1b] = '\0';
  (pCVar1->state).uploadbuffer[0x1c] = '\0';
  (pCVar1->state).uploadbuffer[0x1d] = '\0';
  (pCVar1->state).uploadbuffer[0x1e] = '\0';
  (pCVar1->state).uploadbuffer[0x1f] = '\0';
  (pCVar1->state).uploadbuffer[0x20] = '\0';
  (pCVar1->state).uploadbuffer[0x21] = '\0';
  (pCVar1->state).uploadbuffer[0x22] = '\0';
  (pCVar1->state).uploadbuffer[0x23] = '\0';
  uVar5 = (short)msg_len + 0x20;
  *(ushort *)((pCVar1->state).uploadbuffer + 2) = uVar5 * 0x100 | uVar5 >> 8;
  (pCVar1->state).uploadbuffer[4] = -1;
  (pCVar1->state).uploadbuffer[5] = 'S';
  (pCVar1->state).uploadbuffer[6] = 'M';
  (pCVar1->state).uploadbuffer[7] = 'B';
  (pCVar1->state).uploadbuffer[8] = cmd;
  (pCVar1->state).uploadbuffer[0xd] = '\x18';
  (pCVar1->state).uploadbuffer[0xe] = 'A';
  (pCVar1->state).uploadbuffer[0xf] = '\0';
  *(unsigned_short *)((pCVar1->state).uploadbuffer + 0x20) = (conn->proto).smbc.uid;
  *(undefined2 *)((pCVar1->state).uploadbuffer + 0x1c) = *(undefined2 *)((long)pvVar2 + 0x18);
  _Var3 = getpid();
  *(short *)((pCVar1->state).uploadbuffer + 0x10) = (short)((uint)_Var3 >> 0x10);
  *(short *)((pCVar1->state).uploadbuffer + 0x1e) = (short)_Var3;
  memcpy((conn->data->state).uploadbuffer + 0x24,msg,msg_len);
  CVar4 = smb_send(conn,msg_len + 0x24,0);
  return CVar4;
}

Assistant:

static CURLcode smb_send_message(struct connectdata *conn, unsigned char cmd,
                                 const void *msg, size_t msg_len)
{
  smb_format_message(conn, (struct smb_header *)conn->data->state.uploadbuffer,
                     cmd, msg_len);
  memcpy(conn->data->state.uploadbuffer + sizeof(struct smb_header),
         msg, msg_len);

  return smb_send(conn, sizeof(struct smb_header) + msg_len, 0);
}